

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_visit_parents(ggml_cgraph *cgraph,ggml_tensor *node)

{
  size_t sVar1;
  size_t sVar2;
  ggml_tensor *in_RSI;
  int *in_RDI;
  int k;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar4;
  
  sVar1 = ggml_hash_insert((ggml_hash_set *)
                           CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                           (ggml_tensor *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (sVar1 != 0xfffffffffffffffe) {
    for (iVar4 = 0; iVar4 < 10; iVar4 = iVar4 + 1) {
      iVar3 = iVar4;
      if ((in_RDI[0x12] != 0) && (in_RDI[0x12] == 1)) {
        iVar3 = 9 - iVar4;
      }
      if (in_RSI->src[iVar3] != (ggml_tensor *)0x0) {
        ggml_visit_parents((ggml_cgraph *)in_RSI,(ggml_tensor *)CONCAT44(iVar4,iVar3));
      }
    }
    if ((in_RSI->op == GGML_OP_NONE) && ((in_RSI->flags & 4U) == 0)) {
      if (*in_RDI <= in_RDI[2]) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                   0x1690,"GGML_ASSERT(%s) failed","cgraph->n_leafs < cgraph->size");
      }
      sVar2 = strlen(in_RSI->name);
      if (sVar2 == 0) {
        ggml_format_name(in_RSI,"leaf_%d",(ulong)(uint)in_RDI[2]);
      }
      *(ggml_tensor **)(*(long *)(in_RDI + 10) + (long)in_RDI[2] * 8) = in_RSI;
      in_RDI[2] = in_RDI[2] + 1;
    }
    else {
      if (*in_RDI <= in_RDI[1]) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                   0x1699,"GGML_ASSERT(%s) failed","cgraph->n_nodes < cgraph->size");
      }
      sVar2 = strlen(in_RSI->name);
      if (sVar2 == 0) {
        ggml_format_name(in_RSI,"node_%d",(ulong)(uint)in_RDI[1]);
      }
      *(ggml_tensor **)(*(long *)(in_RDI + 4) + (long)in_RDI[1] * 8) = in_RSI;
      in_RDI[1] = in_RDI[1] + 1;
    }
  }
  return;
}

Assistant:

static void ggml_visit_parents(struct ggml_cgraph * cgraph, struct ggml_tensor * node) {
    // check if already visited
    if (ggml_hash_insert(&cgraph->visited_hash_set, node) == GGML_HASHSET_ALREADY_EXISTS) {
        return;
    }

    for (int i = 0; i < GGML_MAX_SRC; ++i) {
        const int k =
            (cgraph->order == GGML_CGRAPH_EVAL_ORDER_LEFT_TO_RIGHT) ? i :
            (cgraph->order == GGML_CGRAPH_EVAL_ORDER_RIGHT_TO_LEFT) ? (GGML_MAX_SRC-1-i) :
            /* unknown order, just fall back to using i*/ i;
        if (node->src[k]) {
            ggml_visit_parents(cgraph, node->src[k]);
        }
    }

    if (node->op == GGML_OP_NONE && !(node->flags & GGML_TENSOR_FLAG_PARAM)) {
        // reached a leaf node, not part of the gradient graph (e.g. a constant)
        GGML_ASSERT(cgraph->n_leafs < cgraph->size);

        if (strlen(node->name) == 0) {
            ggml_format_name(node, "leaf_%d", cgraph->n_leafs);
        }

        cgraph->leafs[cgraph->n_leafs] = node;
        cgraph->n_leafs++;
    } else {
        GGML_ASSERT(cgraph->n_nodes < cgraph->size);

        if (strlen(node->name) == 0) {
            ggml_format_name(node, "node_%d", cgraph->n_nodes);
        }

        cgraph->nodes[cgraph->n_nodes] = node;
        cgraph->n_nodes++;
    }
}